

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5c29f0::ECCurveTest_IsOnCurve_Test::TestBody(ECCurveTest_IsOnCurve_Test *this)

{
  EC_GROUP *group;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  dst;
  int iVar1;
  ParamType_conflict *pPVar2;
  EC_POINT *pEVar3;
  EC_POINT *src;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  UniquePtr<EC_POINT> p;
  UniquePtr<EC_KEY> key;
  AssertHelper local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  string local_38;
  _Head_base<0UL,_ec_key_st_*,_false> local_18;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  local_18._M_head_impl = (ec_key_st *)EC_KEY_new_by_curve_name(*pPVar2);
  local_58[0] = (internal)(local_18._M_head_impl != (ec_key_st *)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18._M_head_impl == (ec_key_st *)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)0x607821,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x24d,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
  }
  else {
    iVar1 = EC_KEY_generate_key((EC_KEY *)local_18._M_head_impl);
    local_58[0] = (internal)(iVar1 != 0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_58[0]) {
      group = (this->super_ECCurveTest).group_;
      pEVar3 = EC_KEY_get0_public_key((EC_KEY *)local_18._M_head_impl);
      iVar1 = EC_POINT_is_on_curve((EC_GROUP *)group,pEVar3,(BN_CTX *)0x0);
      local_58[0] = (internal)(iVar1 != 0);
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_58[0]) {
        testing::Message::Message((Message *)&local_48);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_38,local_58,
                   (AssertionResult *)
                   "EC_POINT_is_on_curve(group(), EC_KEY_get0_public_key(key.get()), nullptr)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x252,local_38._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if (local_48._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      pEVar3 = EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
      local_58[0] = (internal)(pEVar3 != (EC_POINT *)0x0);
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar3;
      if (pEVar3 == (EC_POINT *)0x0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_38,local_58,(AssertionResult *)0x56dfbc,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x255,local_38._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
LAB_002e45b9:
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if (local_60.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
      }
      else {
        src = EC_KEY_get0_public_key((EC_KEY *)local_18._M_head_impl);
        iVar1 = EC_POINT_copy(pEVar3,src);
        local_58[0] = (internal)(iVar1 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_38,local_58,
                     (AssertionResult *)"EC_POINT_copy(p.get(), EC_KEY_get0_public_key(key.get()))",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x256,local_38._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
          goto LAB_002e45b9;
        }
        *(undefined8 *)(local_48._M_head_impl + 0x38) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0x40) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0x28) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0x30) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0x18) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0x20) = 0;
        *(undefined8 *)(local_48._M_head_impl + 8) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0x10) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0x48) = 0;
        iVar1 = EC_POINT_is_on_curve
                          ((EC_GROUP *)(this->super_ECCurveTest).group_,
                           (EC_POINT *)local_48._M_head_impl,(BN_CTX *)0x0);
        local_58[0] = (internal)(iVar1 == 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_58[0]) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_38,local_58,
                     (AssertionResult *)"EC_POINT_is_on_curve(group(), p.get(), nullptr)","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x25b,local_38._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38._M_dataplus._M_p != &local_38.field_2) {
            operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
          }
          if (local_60.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_60.data_ + 8))();
          }
        }
        if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_50,local_50);
        }
        dst._M_head_impl = local_48._M_head_impl;
        pEVar3 = EC_KEY_get0_public_key((EC_KEY *)local_18._M_head_impl);
        iVar1 = EC_POINT_copy((EC_POINT *)dst._M_head_impl,pEVar3);
        local_58[0] = (internal)(iVar1 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_38,local_58,
                     (AssertionResult *)"EC_POINT_copy(p.get(), EC_KEY_get0_public_key(key.get()))",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x25e,local_38._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
          goto LAB_002e45b9;
        }
        *(undefined8 *)(local_48._M_head_impl + 200) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0xd0) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0xb8) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0xc0) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0xa8) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0xb0) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0x98) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0xa0) = 0;
        *(undefined8 *)(local_48._M_head_impl + 0xd8) = 0;
        iVar1 = EC_POINT_is_on_curve
                          ((EC_GROUP *)(this->super_ECCurveTest).group_,
                           (EC_POINT *)local_48._M_head_impl,(BN_CTX *)0x0);
        local_58[0] = (internal)(iVar1 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_58[0]) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_38,local_58,
                     (AssertionResult *)"EC_POINT_is_on_curve(group(), p.get(), nullptr)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x260,local_38._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
          goto LAB_002e45b9;
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_48);
      goto LAB_002e460a;
    }
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)"EC_KEY_generate_key(key.get())","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x24e,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
LAB_002e460a:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

TEST_P(ECCurveTest, IsOnCurve) {
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  // The generated point is on the curve.
  EXPECT_TRUE(EC_POINT_is_on_curve(group(), EC_KEY_get0_public_key(key.get()),
                                   nullptr));

  bssl::UniquePtr<EC_POINT> p(EC_POINT_new(group()));
  ASSERT_TRUE(p);
  ASSERT_TRUE(EC_POINT_copy(p.get(), EC_KEY_get0_public_key(key.get())));

  // This should never happen outside of a bug, but |EC_POINT_is_on_curve|
  // rejects points not on the curve.
  OPENSSL_memset(&p->raw.X, 0, sizeof(p->raw.X));
  EXPECT_FALSE(EC_POINT_is_on_curve(group(), p.get(), nullptr));

  // The point at infinity is always on the curve.
  ASSERT_TRUE(EC_POINT_copy(p.get(), EC_KEY_get0_public_key(key.get())));
  OPENSSL_memset(&p->raw.Z, 0, sizeof(p->raw.Z));
  EXPECT_TRUE(EC_POINT_is_on_curve(group(), p.get(), nullptr));
}